

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool check_more_than_two_unique_values
               (size_t *ix_arr,size_t st,size_t end,int *x,MissingAction missing_action)

{
  size_t ix_1;
  int x0_1;
  size_t ix;
  int x0;
  MissingAction missing_action_local;
  int *x_local;
  size_t end_local;
  size_t st_local;
  size_t *ix_arr_local;
  
  if (1 < end - st) {
    ix_1 = st;
    if (missing_action == Fail) {
      for (ix = st + 1; ix <= end; ix = ix + 1) {
        if (x[ix_arr[ix]] != x[ix_arr[st]]) {
          return true;
        }
      }
    }
    else {
      for (; ix_1 <= end; ix_1 = ix_1 + 1) {
        if (-1 < x[ix_arr[ix_1]]) {
          x0_1 = x[ix_arr[ix_1]];
          ix_1 = ix_1 + 1;
          break;
        }
      }
      for (; ix_1 <= end; ix_1 = ix_1 + 1) {
        if ((-1 < x[ix_arr[ix_1]]) && (x[ix_arr[ix_1]] != x0_1)) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool check_more_than_two_unique_values(size_t ix_arr[], size_t st, size_t end, int x[], MissingAction missing_action)
{
    if (end - st <= 1) return false;

    if (missing_action == Fail)
    {
        int x0 = x[ix_arr[st]];
        for (size_t ix = st+1; ix <= end; ix++)
        {
            if (x[ix_arr[ix]] != x0) return true;
        }
    }

    else
    {
        int x0;
        size_t ix;
        for (ix = st; ix <= end; ix++)
        {
            if (x[ix_arr[ix]] >= 0)
            {
                x0 = x[ix_arr[ix]];
                ix++;
                break;
            }
        }

        for (; ix <= end; ix++)
        {
            if (x[ix_arr[ix]] >= 0 && x[ix_arr[ix]] != x0)
                return true;
        }
    }

    return false;
}